

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::tracker_list::replace
          (tracker_list *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *aes)

{
  header_holder_type *this_node;
  trackers_t *this_00;
  byte *pbVar1;
  node_ptr plVar2;
  pointer paVar3;
  node_ptr plVar4;
  node_ptr plVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  node_ptr to_erase;
  element_type *chunk;
  node_ptr plVar8;
  undefined8 *puVar9;
  uint uVar10;
  size_t i;
  long lVar11;
  ulong uVar12;
  size_t i_1;
  long lVar13;
  size_type sVar14;
  ulong uVar15;
  ulong uVar16;
  list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
  *plVar17;
  announce_entry *ae;
  pointer a0;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_false,_true>,_bool>
  pVar18;
  array_initializer<boost::intrusive::list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>,_64UL>
  counter;
  size_type local_658;
  undefined1 local_650 [16];
  tracker_list *local_640;
  size_type local_638;
  list_node<void_*> local_630 [95];
  undefined8 local_38;
  
  this_node = &(this->m_trackers).super_type.data_.root_plus_size_.m_header;
  plVar5 = (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar5 != &this_node->super_node) {
    plVar2 = plVar5->next_;
    plVar5->next_ = (node_ptr)0x0;
    plVar5->prev_ = (node_ptr)0x0;
    plVar5 = plVar2;
  }
  this_00 = &this->m_trackers;
  (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_ =
       &this_node->super_node;
  (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       &this_node->super_node;
  (this->m_trackers).super_type.data_.root_plus_size_.super_size_traits.size_ = 0;
  ::std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->m_url_index)._M_h);
  boost::object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
  ~object_pool(&this->m_storage);
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.list.sz = 0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.list.ptr = (char *)0x0;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.requested_size = 0x70;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.next_size = 0x20;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.start_size = 0x20;
  (this->m_storage).super_pool<boost::default_user_allocator_new_delete>.max_size = 0;
  paVar3 = (aes->
           super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (a0 = (aes->
            super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            )._M_impl.super__Vector_impl_data._M_start; a0 != paVar3; a0 = a0 + 1) {
    if ((a0->url)._M_string_length != 0) {
      chunk = boost::
              object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>
              ::construct<libtorrent::v1_2::announce_entry>(&this->m_storage,a0);
      local_630[0].next_ = (node_ptr)(chunk->url)._M_dataplus._M_p;
      local_638 = (chunk->url)._M_string_length;
      local_630[0].prev_ = (node_ptr)chunk;
      pVar18 = ::std::
               _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,libtorrent::aux::announce_entry*>>
                         ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,libtorrent::aux::announce_entry*>>,std::__detail::_Select1st,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&this->m_url_index,&local_638);
      if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        boost::
        object_pool<libtorrent::aux::announce_entry,_boost::default_user_allocator_new_delete>::
        destroy(&this->m_storage,chunk);
        pbVar1 = (byte *)(*(long *)((long)pVar18.first.
                                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_true>
                                          ._M_cur.
                                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::aux::announce_entry_*>,_true>
                                   + 0x18) + 0x6e);
        *pbVar1 = *pbVar1 | a0->field_0x5a & 0xf;
      }
      else {
        boost::intrusive::
        list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
        ::push_back(&this_00->super_type,chunk);
      }
    }
  }
  plVar8 = (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar8 != (this->m_trackers).super_type.data_.root_plus_size_.m_header.super_node.prev_) {
    local_658 = 0;
    local_650._0_8_ = (node_ptr)local_650;
    local_650._8_8_ = (node_ptr)local_650;
    lVar11 = 0;
    do {
      lVar13 = (long)&local_630[0].next_ + lVar11;
      *(undefined8 *)((long)&local_638 + lVar11) = 0;
      *(long *)lVar13 = lVar13;
      *(long *)((long)&local_630[0].prev_ + lVar11) = lVar13;
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x600);
    uVar12 = 0;
    if (plVar8 != &this_node->super_node && plVar8 != (node_ptr)0x0) {
      local_640 = this;
      sVar14 = 0;
      uVar12 = 0;
      do {
        plVar4 = plVar8->next_;
        if (plVar8 != (node_ptr)local_650._0_8_ && plVar4 != (node_ptr)local_650._0_8_) {
          plVar5 = *(node_ptr *)(local_650._0_8_ + 8);
          plVar2 = plVar8->prev_;
          plVar5->next_ = plVar8;
          plVar8->prev_ = plVar5;
          plVar8->next_ = (node_ptr)local_650._0_8_;
          *(node_ptr *)(local_650._0_8_ + 8) = plVar8;
          plVar4->prev_ = plVar2;
          plVar2->next_ = plVar4;
        }
        (this_00->super_type).data_.root_plus_size_.super_size_traits.size_ =
             (this_00->super_type).data_.root_plus_size_.super_size_traits.size_ - 1;
        local_658 = sVar14 + 1;
        if (uVar12 == 0) {
          uVar16 = 0;
        }
        else {
          plVar17 = (list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
                     *)&local_638;
          uVar15 = 0;
          do {
            uVar16 = uVar15;
            if ((*(node_ptr *)(plVar17 + 8) == (node_ptr)0x0) ||
               ((node_ptr)(plVar17 + 8) == *(node_ptr *)(plVar17 + 8))) break;
            boost::intrusive::
            list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
            ::
            merge<libtorrent::aux::tracker_list::replace(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>const&)::__0>
                      (plVar17,&local_658);
            boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>
            ::swap_nodes((node_ptr)local_650,(node_ptr)(plVar17 + 8));
            uVar15 = uVar15 + 1;
            sVar14 = *(size_type *)plVar17;
            *(size_type *)plVar17 = local_658;
            plVar17 = plVar17 + 0x18;
            uVar16 = uVar12;
            local_658 = sVar14;
          } while (uVar12 != uVar15);
        }
        boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
        swap_nodes((node_ptr)local_650,(node_ptr)((long)local_630 + (uVar16 & 0xffffffff) * 0x18));
        sVar14 = (&local_638)[(uVar16 & 0xffffffff) * 3];
        (&local_638)[(uVar16 & 0xffffffff) * 3] = local_658;
        uVar10 = (uint)((int)uVar16 == (int)uVar12) + (int)uVar12;
        uVar12 = (ulong)uVar10;
        plVar8 = (this_node->super_node).next_;
      } while ((plVar8 != (node_ptr)0x0) && (plVar8 != &this_node->super_node));
      this = local_640;
      local_658 = sVar14;
      if (1 < uVar10) {
        uVar12 = (ulong)uVar10;
        lVar11 = uVar12 - 1;
        plVar17 = (list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
                   *)&local_638;
        do {
          boost::intrusive::
          list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::announce_entry::list_hook>,unsigned_long,true,void>
          ::
          merge<libtorrent::aux::tracker_list::replace(std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>const&)::__0>
                    (plVar17 + 0x18,plVar17);
          lVar11 = lVar11 + -1;
          plVar17 = plVar17 + 0x18;
          this = local_640;
        } while (lVar11 != 0);
      }
    }
    boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
    swap_nodes(&this_node->super_node,(node_ptr)(local_650 + uVar12 * 0x18 + 8));
    (this_00->super_type).data_.root_plus_size_.super_size_traits.size_ =
         *(unsigned_long *)(local_650 + uVar12 * 0x18);
    lVar11 = 0;
    puVar9 = &local_38;
    do {
      puVar7 = (undefined8 *)puVar9[-2];
      while (puVar7 != puVar9 + -2) {
        puVar6 = (undefined8 *)*puVar7;
        *puVar7 = 0;
        puVar7[1] = 0;
        puVar7 = puVar6;
      }
      puVar9[-3] = 0;
      puVar9[-2] = 0;
      puVar9[-1] = 0;
      lVar11 = lVar11 + 1;
      puVar9 = puVar9 + -3;
    } while (lVar11 != 0x40);
    while ((node_ptr)local_650._0_8_ != (node_ptr)local_650) {
      plVar5 = ((node_ptr)local_650._0_8_)->next_;
      ((node_ptr)local_650._0_8_)->next_ = (node_ptr)0x0;
      ((node_ptr)local_650._0_8_)->prev_ = (node_ptr)0x0;
      local_650._0_8_ = plVar5;
    }
  }
  this->m_last_working_tracker = (announce_entry *)0x0;
  return;
}

Assistant:

void tracker_list::replace(std::vector<lt::announce_entry> const& aes)
{
	INVARIANT_CHECK;

	m_trackers.clear();
	m_url_index.clear();

	m_storage.~object_pool<aux::announce_entry>();
	new (&m_storage) boost::object_pool<aux::announce_entry>();

	for (auto const& ae : aes)
	{
		if (ae.url.empty()) continue;
		aux::announce_entry* new_ae = m_storage.construct(ae);
		auto const [iter, added] = m_url_index.insert(std::make_pair(string_view(new_ae->url), new_ae));
		if (!added)
		{
			// if we already have an entry with this URL, skip it
			// but merge the source bits
			m_storage.destroy(new_ae);
			iter->second->source |= ae.source;
			continue;
		}
		m_trackers.push_back(*new_ae);
	}

	// make sure the trackers are correctly ordered by tier
	m_trackers.sort([](aux::announce_entry const& lhs, aux::announce_entry const& rhs)
	{ return lhs.tier < rhs.tier; });

	m_last_working_tracker = nullptr;
}